

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

bool __thiscall NanoVM::execute(NanoVM *this,Instruction *inst)

{
  uchar uVar1;
  uchar uVar2;
  ulong *puVar3;
  byte bVar4;
  ushort uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *__format;
  uint64_t *puVar10;
  uint64_t *puVar11;
  bool bVar12;
  bool bVar13;
  
  if (inst->isDstMem == true) {
    uVar7 = (ulong)inst->dstReg;
    puVar10 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[uVar7]);
  }
  else {
    uVar7 = (ulong)inst->dstReg;
    puVar10 = (this->cpu).registers + uVar7;
  }
  if (inst->srcType == '\0') {
    if (inst->isSrcMem == false) {
      uVar8 = (ulong)inst->srcReg;
      puVar11 = (this->cpu).registers + uVar8;
    }
    else {
      uVar8 = (ulong)inst->srcReg;
      puVar11 = (uint64_t *)((this->cpu).codeBase + (this->cpu).registers[uVar8]);
    }
    bVar4 = 0;
  }
  else {
    puVar11 = (uint64_t *)((this->cpu).codeBase + inst->immediate);
    if (inst->isSrcMem == false) {
      puVar11 = &inst->immediate;
    }
    bVar4 = inst->isDstMem ^ 1;
    uVar8 = (ulong)inst->srcReg;
  }
  if ((((puVar11 != &inst->immediate) && (puVar11 != (this->cpu).registers + uVar8)) &&
      ((puVar3 = (ulong *)(this->cpu).codeBase, puVar11 < puVar3 ||
       ((ulong *)((long)puVar3 + (this->cpu).stackSize + (this->cpu).codeSize) <= puVar11)))) ||
     ((puVar10 != (this->cpu).registers + uVar7 &&
      ((puVar3 = (ulong *)(this->cpu).codeBase, puVar10 < puVar3 ||
       ((ulong *)((long)puVar3 + (this->cpu).stackSize + (this->cpu).codeSize) < puVar10)))))) {
    this->errorFlag = ' ';
    return false;
  }
  uVar1 = inst->srcSize;
  uVar2 = inst->opcode;
  if (uVar1 != '\x02') {
    if (uVar1 == '\x01') {
      if (bVar4 != 0) {
        bVar12 = false;
        switch(uVar2) {
        case '\0':
          uVar7 = (ulong)(ushort)*puVar11;
          break;
        case '\x01':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101dc2;
        case '\x02':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101df4;
        case '\x03':
          uVar9 = (uint)(ushort)*puVar11;
LAB_00101dfe:
          uVar7 = (ulong)(uVar9 & (uint)*puVar10);
          break;
        case '\x04':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101e8d;
        case '\x05':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101e57;
        case '\x06':
          goto switchD_00101851_caseD_6;
        case '\a':
          goto switchD_00101851_caseD_7;
        default:
          goto switchD_00101851_caseD_8;
        case '\n':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101e60;
        case '\v':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101e48;
        case '\f':
          uVar7 = (ulong)(ushort)*puVar11;
          goto LAB_00101d72;
        case '\r':
          goto switchD_00101879_caseD_d;
        case '\x0e':
          goto switchD_00101879_caseD_e;
        case '\x0f':
          goto switchD_00101879_caseD_f;
        case '\x10':
          goto switchD_00101879_caseD_10;
        case '\x11':
          goto switchD_00101879_caseD_11;
        case '\x12':
          goto switchD_00101879_caseD_12;
        case '\x14':
          goto switchD_00101879_caseD_14;
        case '\x15':
          goto switchD_00101879_caseD_15;
        case '\x16':
          goto switchD_00101851_caseD_16;
        case '\x17':
          goto switchD_00101879_caseD_17;
        case '\x18':
          goto switchD_00101879_caseD_18;
        case '\x19':
          goto switchD_00101879_caseD_19;
        case '\x1b':
          goto switchD_00101879_caseD_1b;
        case '\x1c':
          goto switchD_00101851_caseD_1c;
        case '\x1d':
          goto switchD_00101879_caseD_1d;
        }
        goto LAB_00101e65;
      }
      bVar12 = false;
      switch(uVar2) {
      case '\0':
        uVar5 = (ushort)*puVar11;
        goto LAB_00101ecb;
      case '\x01':
        *(ushort *)puVar10 = (ushort)*puVar10 + (ushort)*puVar11;
        break;
      case '\x02':
        *(ushort *)puVar10 = (ushort)*puVar10 - (ushort)*puVar11;
        break;
      case '\x03':
        *(ushort *)puVar10 = (ushort)*puVar10 & (ushort)*puVar11;
        break;
      case '\x04':
        *(ushort *)puVar10 = (ushort)*puVar10 | (ushort)*puVar11;
        break;
      case '\x05':
        *(ushort *)puVar10 = (ushort)*puVar10 ^ (ushort)*puVar11;
        break;
      case '\x06':
        uVar5 = (ushort)*puVar10 >> ((byte)*puVar11 & 0x1f);
        goto LAB_00101e3e;
      case '\a':
        uVar5 = (ushort)*puVar10 << ((byte)*puVar11 & 0x1f);
LAB_00101e3e:
        *(ushort *)puVar10 = uVar5;
        break;
      default:
        goto switchD_00101851_caseD_8;
      case '\n':
        uVar5 = (ushort)*puVar10 * (ushort)*puVar11;
        goto LAB_00101ecb;
      case '\v':
        uVar5 = (ushort)*puVar10 / (ushort)*puVar11;
        goto LAB_00101ecb;
      case '\f':
        *(ushort *)puVar10 = (ushort)*puVar10 % (ushort)*puVar11;
        break;
      case '\r':
switchD_00101879_caseD_d:
        bVar12 = (ushort)*puVar10 < (ushort)*puVar11;
        bVar13 = (ushort)*puVar10 == (ushort)*puVar11;
        goto joined_r0x001019ba;
      case '\x0e':
switchD_00101879_caseD_e:
        bVar4 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101979;
      case '\x0f':
switchD_00101879_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101879_caseD_12;
        break;
      case '\x10':
switchD_00101879_caseD_10:
        bVar4 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101979;
      case '\x11':
switchD_00101879_caseD_11:
        bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101979:
        if (bVar4 == 0) break;
switchD_00101879_caseD_12:
        uVar7 = (ulong)(short)(ushort)*puVar11;
        goto LAB_00101e6e;
      case '\x12':
        goto switchD_00101879_caseD_12;
      case '\x14':
switchD_00101879_caseD_14:
        *(ushort *)puVar11 = (ushort)*puVar11 + 1;
        break;
      case '\x15':
switchD_00101879_caseD_15:
        *(ushort *)puVar11 = (ushort)*puVar11 - 1;
        break;
      case '\x16':
        goto switchD_00101851_caseD_16;
      case '\x17':
switchD_00101879_caseD_17:
        push<unsigned_long>(this,(ulong)inst->instructionSize + (this->cpu).registers[8]);
        goto switchD_00101879_caseD_12;
      case '\x18':
switchD_00101879_caseD_18:
        push<unsigned_short>(this,(unsigned_short)*puVar11);
        break;
      case '\x19':
switchD_00101879_caseD_19:
        uVar5 = pop<unsigned_short>(this);
LAB_00101ecb:
        *(ushort *)puVar10 = uVar5;
        break;
      case '\x1b':
switchD_00101879_caseD_1b:
        uVar7 = (ulong)(ushort)*puVar11;
        goto LAB_00101bcf;
      case '\x1c':
        goto switchD_00101851_caseD_1c;
      case '\x1d':
switchD_00101879_caseD_1d:
        uVar9 = (uint)(ushort)*puVar11;
        goto LAB_001019c9;
      }
      goto LAB_00101e69;
    }
    if (uVar1 == '\0') {
      if (bVar4 != 0) {
        bVar12 = false;
        switch(uVar2) {
        case '\0':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101e65;
        case '\x01':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101dc2;
        case '\x02':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101df4;
        case '\x03':
          uVar9 = (uint)(byte)*puVar11;
          goto LAB_00101dfe;
        case '\x04':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101e8d;
        case '\x05':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101e57;
        case '\x06':
          goto switchD_00101851_caseD_6;
        case '\a':
          goto switchD_00101851_caseD_7;
        default:
          goto switchD_00101851_caseD_8;
        case '\n':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101e60;
        case '\v':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101e48;
        case '\f':
          uVar7 = (ulong)(byte)*puVar11;
          goto LAB_00101d72;
        case '\r':
          goto switchD_00101851_caseD_d;
        case '\x0e':
          goto switchD_00101851_caseD_e;
        case '\x0f':
          goto switchD_00101851_caseD_f;
        case '\x10':
          goto switchD_00101851_caseD_10;
        case '\x11':
          goto switchD_00101851_caseD_11;
        case '\x12':
          goto switchD_00101851_caseD_12;
        case '\x14':
          goto switchD_00101851_caseD_14;
        case '\x15':
          goto switchD_00101851_caseD_15;
        case '\x16':
          goto switchD_00101851_caseD_16;
        case '\x17':
          goto switchD_00101851_caseD_17;
        case '\x18':
          goto switchD_00101851_caseD_18;
        case '\x19':
          goto switchD_00101851_caseD_19;
        case '\x1b':
          goto switchD_00101851_caseD_1b;
        case '\x1c':
          goto switchD_00101851_caseD_1c;
        case '\x1d':
          goto switchD_00101851_caseD_1d;
        }
      }
      bVar12 = false;
      switch(uVar2) {
      case '\0':
        bVar4 = (byte)*puVar11;
        goto LAB_00101ee9;
      case '\x01':
        *(byte *)puVar10 = (byte)*puVar10 + (byte)*puVar11;
        break;
      case '\x02':
        *(byte *)puVar10 = (byte)*puVar10 - (byte)*puVar11;
        break;
      case '\x03':
        *(byte *)puVar10 = (byte)*puVar10 & (byte)*puVar11;
        break;
      case '\x04':
        *(byte *)puVar10 = (byte)*puVar10 | (byte)*puVar11;
        break;
      case '\x05':
        *(byte *)puVar10 = (byte)*puVar10 ^ (byte)*puVar11;
        break;
      case '\x06':
        bVar4 = (byte)*puVar10 >> ((byte)*puVar11 & 0x1f);
        goto LAB_00101e9d;
      case '\a':
        bVar4 = (byte)*puVar10 << ((byte)*puVar11 & 0x1f);
        goto LAB_00101e9d;
      default:
        goto switchD_00101851_caseD_8;
      case '\n':
        bVar4 = (byte)*puVar10 * (byte)*puVar11;
        goto LAB_00101ee9;
      case '\v':
        bVar4 = (byte)*puVar10 / (byte)*puVar11;
        goto LAB_00101ee9;
      case '\f':
        bVar4 = (byte)*puVar10 % (byte)*puVar11;
LAB_00101e9d:
        *(byte *)puVar10 = bVar4;
        break;
      case '\r':
switchD_00101851_caseD_d:
        bVar12 = (byte)*puVar10 < (byte)*puVar11;
        bVar13 = (byte)*puVar10 == (byte)*puVar11;
        if (bVar13) goto LAB_00101ae4;
        goto LAB_00101af1;
      case '\x0e':
switchD_00101851_caseD_e:
        bVar4 = (byte)(this->cpu).registers[9] & 0x80;
        goto joined_r0x00101990;
      case '\x0f':
switchD_00101851_caseD_f:
        if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_00101851_caseD_12;
        break;
      case '\x10':
switchD_00101851_caseD_10:
        bVar4 = (byte)(this->cpu).registers[9] & 0x40;
        goto joined_r0x00101990;
      case '\x11':
switchD_00101851_caseD_11:
        bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101990:
        if (bVar4 == 0) break;
switchD_00101851_caseD_12:
        uVar7 = (ulong)(char)(byte)*puVar11;
        goto LAB_00101e6e;
      case '\x12':
        goto switchD_00101851_caseD_12;
      case '\x14':
switchD_00101851_caseD_14:
        *(byte *)puVar11 = (byte)*puVar11 + 1;
        break;
      case '\x15':
switchD_00101851_caseD_15:
        *(byte *)puVar11 = (byte)*puVar11 - 1;
        break;
      case '\x16':
        goto switchD_00101851_caseD_16;
      case '\x17':
switchD_00101851_caseD_17:
        push<unsigned_long>(this,(ulong)inst->instructionSize + (this->cpu).registers[8]);
        goto switchD_00101851_caseD_12;
      case '\x18':
switchD_00101851_caseD_18:
        push<unsigned_char>(this,(byte)*puVar11);
        break;
      case '\x19':
switchD_00101851_caseD_19:
        bVar4 = pop<unsigned_char>(this);
LAB_00101ee9:
        *(byte *)puVar10 = bVar4;
        break;
      case '\x1b':
switchD_00101851_caseD_1b:
        uVar7 = (ulong)(byte)*puVar11;
        goto LAB_00101bcf;
      case '\x1c':
        goto switchD_00101851_caseD_1c;
      case '\x1d':
switchD_00101851_caseD_1d:
        uVar9 = (uint)(byte)*puVar11;
        goto LAB_001019c9;
      }
      goto LAB_00101e69;
    }
    bVar12 = false;
    switch(uVar2) {
    case '\0':
      uVar7 = *puVar11;
      goto LAB_00101e65;
    case '\x01':
      uVar7 = *puVar11;
LAB_00101dc2:
      *puVar10 = *puVar10 + uVar7;
      break;
    case '\x02':
      uVar7 = *puVar11;
LAB_00101df4:
      *puVar10 = *puVar10 - uVar7;
      break;
    case '\x03':
      *puVar10 = *puVar10 & *puVar11;
      break;
    case '\x04':
      uVar7 = *puVar11;
LAB_00101e8d:
      *puVar10 = *puVar10 | uVar7;
      break;
    case '\x05':
      uVar7 = *puVar11;
LAB_00101e57:
      *puVar10 = *puVar10 ^ uVar7;
      break;
    case '\x06':
switchD_00101851_caseD_6:
      *puVar10 = *puVar10 >> ((byte)*puVar11 & 0x3f);
      break;
    case '\a':
switchD_00101851_caseD_7:
      *puVar10 = *puVar10 << ((byte)*puVar11 & 0x3f);
      break;
    default:
      goto switchD_00101851_caseD_8;
    case '\n':
      uVar7 = *puVar10 * *puVar11;
      goto LAB_00101e65;
    case '\v':
      uVar7 = *puVar10 / *puVar11;
      goto LAB_00101e65;
    case '\f':
      uVar7 = *puVar10 % *puVar11;
      goto LAB_00101d7b;
    case '\r':
      if (*puVar10 != *puVar11) {
        if (*puVar11 < *puVar10) goto LAB_00101af3;
        goto LAB_00101a99;
      }
      goto LAB_00101ae4;
    case '\x0e':
      bVar4 = (byte)(this->cpu).registers[9] & 0x80;
      goto joined_r0x00101c4a;
    case '\x0f':
      if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_001018c4_caseD_12;
      break;
    case '\x10':
      bVar4 = (byte)(this->cpu).registers[9] & 0x40;
      goto joined_r0x00101c4a;
    case '\x11':
      bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101c4a:
      if (bVar4 == 0) break;
switchD_001018c4_caseD_12:
      uVar7 = *puVar11;
      goto LAB_00101e6e;
    case '\x12':
      goto switchD_001018c4_caseD_12;
    case '\x14':
      *puVar11 = *puVar11 + 1;
      break;
    case '\x15':
      *puVar11 = *puVar11 - 1;
      break;
    case '\x16':
      goto switchD_00101851_caseD_16;
    case '\x17':
      push<unsigned_long>(this,(ulong)inst->instructionSize + (this->cpu).registers[8]);
      goto switchD_001018c4_caseD_12;
    case '\x18':
      push<unsigned_long>(this,*puVar11);
      break;
    case '\x19':
      uVar7 = pop<unsigned_long>(this);
      goto LAB_00101e65;
    case '\x1b':
      puVar11 = (uint64_t *)*puVar11;
      __format = "%lu";
      goto LAB_001019dd;
    case '\x1c':
      goto switchD_00101851_caseD_1c;
    case '\x1d':
      goto switchD_001018c4_caseD_1d;
    }
    goto LAB_00101e69;
  }
  if (bVar4 == 0) {
    bVar12 = false;
    switch(uVar2) {
    case '\0':
      uVar9 = (uint)*puVar11;
      goto LAB_00101edb;
    case '\x01':
      *(uint *)puVar10 = (uint)*puVar10 + (uint)*puVar11;
      break;
    case '\x02':
      *(uint *)puVar10 = (uint)*puVar10 - (uint)*puVar11;
      break;
    case '\x03':
      *(uint *)puVar10 = (uint)*puVar10 & (uint)*puVar11;
      break;
    case '\x04':
      *(uint *)puVar10 = (uint)*puVar10 | (uint)*puVar11;
      break;
    case '\x05':
      *(uint *)puVar10 = (uint)*puVar10 ^ (uint)*puVar11;
      break;
    case '\x06':
      *(uint *)puVar10 = (uint)*puVar10 >> ((byte)*puVar11 & 0x1f);
      break;
    case '\a':
      *(uint *)puVar10 = (uint)*puVar10 << ((byte)*puVar11 & 0x1f);
      break;
    default:
      goto switchD_00101851_caseD_8;
    case '\n':
      uVar9 = (uint)*puVar10 * (uint)*puVar11;
      goto LAB_00101edb;
    case '\v':
      uVar9 = (uint)*puVar10 / (uint)*puVar11;
LAB_00101edb:
      *(uint *)puVar10 = uVar9;
      break;
    case '\f':
      *(uint *)puVar10 = (uint)*puVar10 % (uint)*puVar11;
      break;
    case '\r':
      goto switchD_001018a1_caseD_d;
    case '\x0e':
      goto switchD_001018a1_caseD_e;
    case '\x0f':
      goto switchD_001018a1_caseD_f;
    case '\x10':
      goto switchD_001018a1_caseD_10;
    case '\x11':
      goto switchD_001018a1_caseD_11;
    case '\x12':
      goto switchD_001018a1_caseD_12;
    case '\x14':
      goto switchD_001018a1_caseD_14;
    case '\x15':
      goto switchD_001018a1_caseD_15;
    case '\x16':
      goto switchD_00101851_caseD_16;
    case '\x17':
      goto switchD_001018a1_caseD_17;
    case '\x18':
      goto switchD_001018a1_caseD_18;
    case '\x19':
      goto switchD_001018a1_caseD_19;
    case '\x1b':
      goto switchD_001018a1_caseD_1b;
    case '\x1c':
      goto switchD_00101851_caseD_1c;
    case '\x1d':
      goto switchD_001018c4_caseD_1d;
    }
    goto LAB_00101e69;
  }
  bVar12 = false;
  switch(uVar2) {
  case '\0':
    uVar7 = (ulong)(uint)*puVar11;
    goto LAB_00101e65;
  case '\x01':
    uVar7 = (ulong)(uint)*puVar11;
    goto LAB_00101dc2;
  case '\x02':
    uVar7 = (ulong)(uint)*puVar11;
    goto LAB_00101df4;
  case '\x03':
    uVar7 = (ulong)((uint)*puVar10 & (uint)*puVar11);
    goto LAB_00101e65;
  case '\x04':
    uVar7 = (ulong)(uint)*puVar11;
    goto LAB_00101e8d;
  case '\x05':
    uVar7 = (ulong)(uint)*puVar11;
    goto LAB_00101e57;
  case '\x06':
    goto switchD_00101851_caseD_6;
  case '\a':
    goto switchD_00101851_caseD_7;
  default:
    goto switchD_00101851_caseD_8;
  case '\n':
    uVar7 = (ulong)(uint)*puVar11;
LAB_00101e60:
    uVar7 = uVar7 * *puVar10;
    goto LAB_00101e65;
  case '\v':
    uVar7 = (ulong)(uint)*puVar11;
LAB_00101e48:
    uVar7 = *puVar10 / uVar7;
LAB_00101e65:
    *puVar10 = uVar7;
    break;
  case '\f':
    uVar7 = (ulong)(uint)*puVar11;
LAB_00101d72:
    uVar7 = *puVar10 % uVar7;
LAB_00101d7b:
    *puVar10 = uVar7;
    break;
  case '\r':
switchD_001018a1_caseD_d:
    bVar12 = (uint)*puVar10 < (uint)*puVar11;
    bVar13 = (uint)*puVar10 == (uint)*puVar11;
joined_r0x001019ba:
    if (bVar13) {
LAB_00101ae4:
      (this->cpu).registers[9] = 0x80;
    }
    else {
LAB_00101af1:
      if (bVar12 || bVar13) {
LAB_00101a99:
        (this->cpu).registers[9] = 0x20;
      }
      else {
LAB_00101af3:
        (this->cpu).registers[9] = 0x40;
      }
    }
    break;
  case '\x0e':
switchD_001018a1_caseD_e:
    bVar4 = (byte)(this->cpu).registers[9] & 0x80;
    goto joined_r0x00101b70;
  case '\x0f':
switchD_001018a1_caseD_f:
    if (((this->cpu).registers[9] & 0x80) == 0) goto switchD_001018a1_caseD_12;
    break;
  case '\x10':
switchD_001018a1_caseD_10:
    bVar4 = (byte)(this->cpu).registers[9] & 0x40;
    goto joined_r0x00101b70;
  case '\x11':
switchD_001018a1_caseD_11:
    bVar4 = (byte)(this->cpu).registers[9] & 0x20;
joined_r0x00101b70:
    if (bVar4 == 0) break;
switchD_001018a1_caseD_12:
    uVar7 = (ulong)(int)(uint)*puVar11;
    goto LAB_00101e6e;
  case '\x12':
    goto switchD_001018a1_caseD_12;
  case '\x14':
switchD_001018a1_caseD_14:
    *(uint *)puVar11 = (uint)*puVar11 + 1;
    break;
  case '\x15':
switchD_001018a1_caseD_15:
    *(uint *)puVar11 = (uint)*puVar11 - 1;
    break;
  case '\x16':
    goto switchD_00101851_caseD_16;
  case '\x17':
switchD_001018a1_caseD_17:
    push<unsigned_long>(this,(ulong)inst->instructionSize + (this->cpu).registers[8]);
    goto switchD_001018a1_caseD_12;
  case '\x18':
switchD_001018a1_caseD_18:
    push<unsigned_int>(this,(uint)*puVar11);
    break;
  case '\x19':
switchD_001018a1_caseD_19:
    uVar9 = pop<unsigned_int>(this);
    goto LAB_00101edb;
  case '\x1b':
switchD_001018a1_caseD_1b:
    uVar7 = (ulong)(uint)*puVar11;
LAB_00101bcf:
    printf("%lu",uVar7);
    break;
  case '\x1c':
switchD_00101851_caseD_1c:
    __format = "%s";
LAB_001019dd:
    printf(__format,puVar11);
    break;
  case '\x1d':
switchD_001018c4_caseD_1d:
    uVar9 = (uint)*puVar11;
LAB_001019c9:
    putchar(uVar9);
  }
LAB_00101e69:
  uVar7 = (ulong)inst->instructionSize;
LAB_00101e6e:
  puVar10 = (this->cpu).registers + 8;
  *puVar10 = *puVar10 + uVar7;
LAB_00101e72:
  bVar12 = true;
switchD_00101851_caseD_8:
  return bVar12;
switchD_00101851_caseD_16:
  uVar6 = pop<unsigned_long>(this);
  (this->cpu).registers[8] = uVar6;
  goto LAB_00101e72;
}

Assistant:

bool NanoVM::execute(Instruction &inst) {
	// set source and destination addresses
	void *dst, *src;
	bool isDstReg = false;
	dst = (inst.isDstMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.dstReg]) : reinterpret_cast<void*>(&cpu.registers[inst.dstReg]);
	if (inst.srcType == DataType::Reg) {
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + cpu.registers[inst.srcReg]) : reinterpret_cast<void*>(&cpu.registers[inst.srcReg]);
	}
	else {
		isDstReg = (inst.isDstMem) ? false : true;
		src = (inst.isSrcMem) ? reinterpret_cast<void*>(cpu.codeBase + inst.immediate) : reinterpret_cast<void*>(&inst.immediate);
	}
	// Do bounds check
	if ((src != &inst.immediate && src != &cpu.registers[inst.srcReg] && (src < cpu.codeBase || src >= cpu.codeBase + cpu.codeSize + cpu.stackSize)) || (dst != &cpu.registers[inst.dstReg] && (dst < cpu.codeBase || dst > cpu.codeBase + cpu.codeSize + cpu.stackSize))) {
		// Source or destination is out side of VM memory
		errorFlag = MEMORY_ACCESS;
		return false;
	}

	#define MATHOP(INST, OP, SIZE, DSTSIZE) \
    case INST: {         \
		*reinterpret_cast<DSTSIZE*>(dst) OP *reinterpret_cast<SIZE*>(src); \
		break; \
    }

	//USIZE is unsigned and SIZE is signed type => e.g. uint8_t and int8_t 
	#define BRANCH(USIZE, SIZE, DSTSIZE) \
	switch(inst.opcode) { \
		MATHOP(Opcodes::Add, +=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mov, =, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sub, -=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Xor, ^=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::And, &=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Or, |=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sar, >>=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Sal, <<=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Div, /=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mul, *=, USIZE, DSTSIZE) \
		MATHOP(Opcodes::Mod, %=, USIZE, DSTSIZE) \
	case Opcodes::Printi: \
		std::printf("%" PRIu64 "", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Prints: \
		std::printf("%s", src); \
		break; \
	case Opcodes::Printc: \
		std::printf("%c", *reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Inc: \
		*reinterpret_cast<USIZE*>(src) += 1; \
		break; \
	case Opcodes::Dec: \
		*reinterpret_cast<USIZE*>(src) -= 1; \
		break; \
	case Opcodes::Push: \
		push(*reinterpret_cast<USIZE*>(src)); \
		break; \
	case Opcodes::Pop: \
		*reinterpret_cast<USIZE*>(dst) = pop<USIZE>(); \
		break; \
	case Opcodes::Jz: \
		if (cpu.registers[flags] & ZERO_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jnz: \
		if (!(cpu.registers[flags] & ZERO_FLAG)) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jg: \
		if (cpu.registers[flags] & GREATER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Js: \
		if (cpu.registers[flags] & SMALLER_FLAG) { \
			cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
			return true; \
		} \
		break; \
	case Opcodes::Jmp: \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Call: \
		push(cpu.registers[ip] + inst.instructionSize); \
		cpu.registers[ip] += *reinterpret_cast<SIZE*>(src); \
		return true; \
	case Opcodes::Ret: \
		cpu.registers[ip] = pop<uint64_t>(); \
		return true; \
	case Opcodes::Cmp: \
		if (*reinterpret_cast<USIZE*>(dst) == *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = ZERO_FLAG; \
		else if (*reinterpret_cast<USIZE*>(dst) > *reinterpret_cast<USIZE*>(src)) \
			cpu.registers[flags] = GREATER_FLAG; \
		else \
			cpu.registers[flags] = SMALLER_FLAG; \
		break; \
	default: \
		return false; \
	}


	switch (inst.srcSize) {	
	case Size::Byte: 
		if (isDstReg) {
			BRANCH(uint8_t, int8_t, uint64_t);
		}
		else {
			BRANCH(uint8_t, int8_t, uint8_t);
		}
		break; 
	case Size::Short: 
		if (isDstReg) {
			BRANCH(uint16_t, int16_t, uint64_t);
		}
		else {
			BRANCH(uint16_t, int16_t, uint16_t);
		}
		break;
	case Size::Dword: 
		if (isDstReg) {
			BRANCH(uint32_t, int32_t, uint64_t);
		}
		else {
			BRANCH(uint32_t, int32_t, uint32_t);
		}
		break;
	default:
		BRANCH(uint64_t, int64_t, uint64_t);
		break;
	} 
	cpu.registers[ip] += inst.instructionSize;
	return true;
}